

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
findDataOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
              uint8_t head)

{
  uint uVar1;
  bool bVar2;
  ValueLength VVar3;
  byte bVar4;
  byte *pbVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  
  uVar1 = SliceStaticData::FirstSubMap[CONCAT71(in_register_00000031,head) & 0xffffffff];
  pbVar5 = *(byte **)this;
  if (uVar1 == 0) {
    uVar6 = 0;
    bVar4 = 0;
    do {
      pbVar5 = pbVar5 + 1;
      uVar6 = uVar6 + ((ulong)(*pbVar5 & 0x7f) << (bVar4 & 0x3f));
      bVar4 = bVar4 + 7;
    } while ((char)*pbVar5 < '\0');
    VVar3 = 2;
    if (0x7f < uVar6) {
      do {
        VVar3 = VVar3 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar2);
    }
  }
  else if ((((2 < uVar1) || (VVar3 = 2, pbVar5[2] == 0)) &&
           ((3 < uVar1 || (VVar3 = 3, pbVar5[3] == 0)))) &&
          ((5 < uVar1 || (VVar3 = 5, pbVar5[5] == 0)))) {
    return 9;
  }
  return VVar3;
}

Assistant:

ValueLength findDataOffset(uint8_t head) const noexcept {
    // Must be called for a non-empty array or object at start():
    VELOCYPACK_ASSERT(head != 0x01 && head != 0x0a && head <= 0x14);
    unsigned int fsm = SliceStaticData::FirstSubMap[head];
    uint8_t const* start = this->start();
    if (fsm == 0) {
      // need to calculate the offset by reading the dynamic length
      VELOCYPACK_ASSERT(head == 0x13 || head == 0x14);
      return 1 + arangodb::velocypack::getVariableValueLength(
                     readVariableValueLength<false>(start + 1));
    }
    if (fsm <= 2 && start[2] != 0) {
      return 2;
    }
    if (fsm <= 3 && start[3] != 0) {
      return 3;
    }
    if (fsm <= 5 && start[5] != 0) {
      return 5;
    }
    return 9;
  }